

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O2

void __thiscall
VPLGrammar::Parser::BitwiseXorExpressionNode::BuildProgram
          (BitwiseXorExpressionNode *this,Scope *scope,ostream *out)

{
  pointer puVar1;
  __uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_> _Var2;
  size_t i;
  ulong uVar3;
  
  (**(code **)(*(long *)(((this->super_ASTNodeBasic).children_.
                          super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                        ._M_t + 0x28))();
  uVar3 = 1;
  while( true ) {
    puVar1 = (this->super_ASTNodeBasic).children_.
             super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_ASTNodeBasic).children_.
                      super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar3)
    break;
    _Var2._M_t.
    super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
    .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl =
         puVar1[uVar3]._M_t.
         super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
         ._M_t;
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                          .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl +
                0x28))(_Var2._M_t.
                       super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                       .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl,scope,
                       out);
    std::operator<<(out,"    xor\n");
    scope->cur_stack_pos_ = scope->cur_stack_pos_ + -1;
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                children_[0]->BuildProgram(scope, out);
                for (size_t i = 1; i < children_.size(); ++i) {
                    children_[i]->BuildProgram(scope, out);
                    out << "    xor\n";
                    scope->Pop();
                }
            }